

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O2

char * seconds_to_ddhhmmss_string(char *string_buf,size_t string_buf_len,uint32_t seconds)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = (int)((long)(int)seconds / 0x15180) * -0x15180 + seconds;
  uVar1 = (long)iVar3 / 0xe10;
  iVar3 = (int)uVar1 * -0xe10 + iVar3;
  uVar2 = (long)iVar3 / 0x3c;
  snprintf(string_buf,string_buf_len,"%02d:%02d:%02d:%02d",(long)(int)seconds / 0x15180 & 0xffffffff
           ,uVar1 & 0xffffffff,uVar2 & 0xffffffff,(int)uVar2 * -0x3c + iVar3);
  return string_buf;
}

Assistant:

char* seconds_to_ddhhmmss_string(char* string_buf, size_t string_buf_len, uint32_t seconds) {
    int days, hours, minutes, secs;

    secs = seconds;
    days = secs / (3600 * 24);
    secs -= days * (3600 * 24);
    hours = secs / 3600;
    secs -= hours * 3600;
    minutes = secs / 60;
    secs -= minutes * 60;

    snprintf(string_buf, string_buf_len, "%02d:%02d:%02d:%02d", days, hours, minutes, secs);

    return string_buf;
}